

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O1

Interval * __thiscall
vkt::shaderexecutor::FloatFunc3::applyPoint
          (Interval *__return_storage_ptr__,FloatFunc3 *this,EvalContext *ctx,double x,double y,
          double z)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  Interval local_48;
  Interval local_30;
  
  dVar1 = (double)(**(code **)(*(long *)this + 0x60))(this);
  dVar2 = (double)(**(code **)(*(long *)this + 0x68))(dVar1,x,y,z,this,ctx);
  local_48.m_hasNaN = NAN(dVar1);
  dVar3 = INFINITY;
  local_48.m_lo = INFINITY;
  if (!local_48.m_hasNaN) {
    local_48.m_lo = dVar1;
  }
  local_48.m_hi = -INFINITY;
  if (!local_48.m_hasNaN) {
    local_48.m_hi = dVar1;
  }
  local_30.m_hasNaN = NAN(dVar2);
  dVar1 = -INFINITY;
  dVar4 = -INFINITY;
  dVar5 = INFINITY;
  if (!local_30.m_hasNaN) {
    dVar3 = -dVar2;
    dVar1 = dVar3;
    dVar4 = dVar2;
    dVar5 = dVar2;
  }
  local_30.m_lo =
       (double)(~-(ulong)(dVar3 <= dVar5) & (ulong)dVar5 | (ulong)dVar3 & -(ulong)(dVar3 <= dVar5));
  local_30.m_hi =
       (double)(~-(ulong)(dVar4 <= dVar1) & (ulong)dVar4 | (ulong)dVar1 & -(ulong)(dVar4 <= dVar1));
  tcu::operator+(__return_storage_ptr__,&local_48,&local_30);
  return __return_storage_ptr__;
}

Assistant:

virtual Interval	applyPoint		(const EvalContext&	ctx,
										 double				x,
										 double				y,
										 double				z) const
	{
		const double exact	= this->applyExact(x, y, z);
		const double prec	= this->precision(ctx, exact, x, y, z);
		return exact + Interval(-prec, prec);
	}